

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_get_bits(stbi__jpeg *j,int n)

{
  uint uVar1;
  uint uVar2;
  uint k;
  int n_local;
  stbi__jpeg *j_local;
  
  if (j->code_bits < n) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar2 = j->code_buffer << ((byte)n & 0x1f) | j->code_buffer >> (0x20 - (byte)n & 0x1f);
  j->code_buffer = uVar2 & (stbi__bmask[n] ^ 0xffffffff);
  uVar1 = stbi__bmask[n];
  j->code_bits = j->code_bits - n;
  return uVar1 & uVar2;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bits(stbi__jpeg *j, int n) {
  unsigned int k;
  if (j->code_bits < n)
    stbi__grow_buffer_unsafe(j);
  k = stbi_lrot(j->code_buffer, n);
  j->code_buffer = k & ~stbi__bmask[n];
  k &= stbi__bmask[n];
  j->code_bits -= n;
  return k;
}